

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O0

int iniparser_getnsec(dictionary *d)

{
  char *pcVar1;
  int local_20;
  int local_1c;
  int nsec;
  int i;
  dictionary *d_local;
  
  if (d == (dictionary *)0x0) {
    d_local._4_4_ = -1;
  }
  else {
    local_20 = 0;
    for (local_1c = 0; (long)local_1c < d->size; local_1c = local_1c + 1) {
      if ((d->key[local_1c] != (char *)0x0) &&
         (pcVar1 = strchr(d->key[local_1c],0x3a), pcVar1 == (char *)0x0)) {
        local_20 = local_20 + 1;
      }
    }
    d_local._4_4_ = local_20;
  }
  return d_local._4_4_;
}

Assistant:

int iniparser_getnsec(const dictionary * d)
{
    int i ;
    int nsec ;

    if (d==NULL) return -1 ;
    nsec=0 ;
    for (i=0 ; i<d->size ; i++) {
        if (d->key[i]==NULL)
            continue ;
        if (strchr(d->key[i], ':')==NULL) {
            nsec ++ ;
        }
    }
    return nsec ;
}